

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yprp_case(lys_ypr_ctx_conflict *pctx,lysp_node *node)

{
  lysp_node_case *cas;
  lysp_node *child;
  lysp_node *plStack_18;
  int8_t flag;
  lysp_node *node_local;
  lys_ypr_ctx_conflict *pctx_local;
  
  child._7_1_ = '\0';
  plStack_18 = node;
  node_local = (lysp_node *)pctx;
  yprp_node_common1(pctx,node,(int8_t *)((long)&child + 7));
  yprp_node_common2((lys_ypr_ctx_conflict *)node_local,plStack_18,(int8_t *)((long)&child + 7));
  for (cas = (lysp_node_case *)node[1].parent; cas != (lysp_node_case *)0x0;
      cas = (lysp_node_case *)(cas->field_0).node.next) {
    ypr_close_parent((lys_ypr_ctx_conflict *)node_local,(int8_t *)((long)&child + 7));
    yprp_node((lys_ypr_ctx_conflict *)node_local,(lysp_node *)cas);
  }
  node_local->nodetype = node_local->nodetype - 1;
  ypr_close((lys_ypr_ctx_conflict *)node_local,"case",child._7_1_);
  return;
}

Assistant:

static void
yprp_case(struct lys_ypr_ctx *pctx, const struct lysp_node *node)
{
    int8_t flag = 0;
    struct lysp_node *child;
    struct lysp_node_case *cas = (struct lysp_node_case *)node;

    yprp_node_common1(pctx, node, &flag);
    yprp_node_common2(pctx, node, &flag);

    LY_LIST_FOR(cas->child, child) {
        ypr_close_parent(pctx, &flag);
        yprp_node(pctx, child);
    }

    LEVEL--;
    ypr_close(pctx, "case", flag);
}